

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements
          (AttitudeMahonyFilter *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas)

{
  double dVar1;
  Vector3 meas;
  bool bVar2;
  Vector3 linAccMeasUnitVector;
  Matrix3x3 S_acc;
  Vector3 *local_68 [2];
  Vector3 local_58;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&S_acc,"linear acceleration",(allocator<char> *)&linAccMeasUnitVector);
  bVar2 = checkValidMeasurement(linAccMeas,(string *)&S_acc,true);
  std::__cxx11::string::~string((string *)&S_acc);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&S_acc,"gyroscope",(allocator<char> *)&linAccMeasUnitVector);
    bVar2 = checkValidMeasurement(gyroMeas,(string *)&S_acc,false);
    std::__cxx11::string::~string((string *)&S_acc);
    if (bVar2) {
      bVar2 = getUnitVector(linAccMeas,&linAccMeasUnitVector);
      if (bVar2) {
        meas.m_data[1] = linAccMeasUnitVector.m_data[1];
        meas.m_data[0] = linAccMeasUnitVector.m_data[0];
        meas.m_data[2] = linAccMeasUnitVector.m_data[2];
        getAngVelSkewSymmetricMatrixFromMeasurements
                  (&S_acc,meas,&this->m_gravity_direction,
                   1.0 - (this->m_params_mahony).confidence_magnetometer_measurements,
                   &this->m_orientationInSO3);
        mapso3ToR3(&local_58,&S_acc);
        local_68[0] = &this->m_omega_mes;
        local_40.m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_58.m_data;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_68,
                   &local_40);
        (this->m_Omega_y).m_data[2] = gyroMeas->m_data[2];
        dVar1 = gyroMeas->m_data[1];
        (this->m_Omega_y).m_data[0] = gyroMeas->m_data[0];
        (this->m_Omega_y).m_data[1] = dVar1;
        return bVar2;
      }
      iDynTree::reportError
                ("AttitudeMahonyFilter","updateFilterWithMeasurements",
                 "Cannot retrieve unit vector from linear acceleration measuremnts.");
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas)
{
    using iDynTree::toEigen;

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeMahonyFilter", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    iDynTree::Matrix3x3 S_acc = getAngVelSkewSymmetricMatrixFromMeasurements(linAccMeasUnitVector, m_gravity_direction, 1-m_params_mahony.confidence_magnetometer_measurements, m_orientationInSO3);
    toEigen(m_omega_mes) = -toEigen(mapso3ToR3(S_acc));
    m_Omega_y = gyroMeas;

    return true;
}